

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdlib.c
# Opt level: O3

CrispyValue std_list(CrispyValue *value,Vm *vm)

{
  Object *pOVar1;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 aVar2;
  size_t size;
  long lVar3;
  ulong uVar4;
  ObjString *object;
  ObjString *object_00;
  ObjString *string;
  uint uVar5;
  ulong uVar6;
  CrispyValue CVar7;
  
  if (value->type == OBJECT) {
    aVar2 = (anon_union_8_3_4e733eb7_for_CrispyValue_1)(value->field_1).o_value;
    if ((aVar2.o_value)->type == OBJ_STRING) {
      pOVar1 = (Object *)(aVar2.p_value + 0x10);
      size._0_1_ = pOVar1->marked;
      size._1_3_ = *(undefined3 *)&pOVar1->field_0x1;
      size._4_4_ = pOVar1->type;
      object = (ObjString *)new_list(vm,size);
      pOVar1 = (Object *)(aVar2.p_value + 0x10);
      lVar3._0_1_ = pOVar1->marked;
      lVar3._1_3_ = *(undefined3 *)&pOVar1->field_0x1;
      lVar3._4_4_ = pOVar1->type;
      if (lVar3 != 0) {
        uVar5 = 1;
        uVar6 = 0;
        do {
          lVar3 = *(long *)&object->hashed;
          object_00 = new_string(vm,(char *)(&(*(object_t **)(aVar2.p_value + 0x18))->marked + uVar6
                                            ),1);
          CVar7 = create_object(&object_00->object);
          *(ValueType *)(lVar3 + uVar6 * 0x10) = CVar7.type;
          ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(lVar3 + 8 + uVar6 * 0x10))->p_value =
               (uint64_t)CVar7.field_1;
          uVar6 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
          pOVar1 = (Object *)(aVar2.p_value + 0x10);
          uVar4._0_1_ = pOVar1->marked;
          uVar4._1_3_ = *(undefined3 *)&pOVar1->field_0x1;
          uVar4._4_4_ = pOVar1->type;
        } while (uVar6 < uVar4);
      }
      goto LAB_001085a6;
    }
    if ((aVar2.o_value)->type == OBJ_LIST) {
      CVar7.field_1.o_value = (Object *)aVar2.p_value;
      CVar7._0_8_ = 2;
      return CVar7;
    }
  }
  vm->err_flag = true;
  object = new_string(vm,"Invalid type for list()",0x17);
LAB_001085a6:
  CVar7 = create_object(&object->object);
  return CVar7;
}

Assistant:

CrispyValue std_list(CrispyValue *value, Vm *vm) {
    switch (value[0].type) {
        case OBJECT:
            switch (value->o_value->type) {
                case OBJ_LIST:
                    return *value;
                case OBJ_STRING: {
                    ObjString *string = (ObjString *) value->o_value;
                    ObjList *list = new_list(vm, string->length);

                    for (uint32_t i = 0; i < string->length; ++i) {
                        list->content.values[i] =
                                create_object((Object *) new_string(vm, string->start + i, 1));
                    }

                    return create_object((Object *) list);
                }
                default:
                    vm->err_flag = true;
                    return create_object((Object *) new_string(vm, "Invalid type for list()", 23));
            }
        default:
            vm->err_flag = true;
            return create_object((Object *) new_string(vm, "Invalid type for list()", 23));
    }
}